

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O3

void boxsum(int32_t *src,int width,int height,int src_stride,int r,int sqr,int32_t *dst,
           int dst_stride)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  int iVar6;
  int32_t *piVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int *piVar13;
  int32_t *piVar14;
  int iVar15;
  int32_t iVar16;
  int *piVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  int32_t iVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  long local_90;
  
  if (r == 2) {
    if (sqr == 0) {
      if (0 < width) {
        lVar1 = (long)dst_stride;
        lVar18 = (long)src_stride;
        piVar7 = src + lVar18 * 5;
        piVar17 = dst + lVar1 * 2;
        uVar8 = 0;
        do {
          iVar24 = src[uVar8];
          iVar12 = src[lVar18 + uVar8];
          iVar15 = src[(long)(src_stride * 2) + uVar8];
          iVar10 = src[(long)(src_stride * 3) + uVar8];
          iVar23 = iVar12 + iVar24 + iVar15;
          iVar16 = src[(long)(src_stride << 2) + uVar8];
          dst[uVar8] = iVar23;
          dst[lVar1 + uVar8] = iVar23 + iVar10;
          piVar5 = piVar17;
          piVar14 = piVar7;
          lVar19 = (ulong)(height - 3U) - 2;
          iVar23 = iVar24;
          iVar3 = iVar12;
          iVar21 = iVar16;
          if (height < 6) {
            iVar11 = iVar10 + iVar15;
            uVar2 = 2;
          }
          else {
            do {
              iVar12 = iVar15;
              iVar24 = iVar3;
              iVar11 = iVar10 + iVar21;
              *piVar5 = iVar12 + iVar24 + iVar11 + iVar23;
              iVar16 = *piVar14;
              lVar19 = lVar19 + -1;
              piVar5 = piVar5 + lVar1;
              piVar14 = piVar14 + lVar18;
              iVar23 = iVar24;
              iVar3 = iVar12;
              iVar15 = iVar10;
              iVar10 = iVar21;
              iVar21 = iVar16;
              uVar2 = height - 3U;
            } while (lVar19 != 0);
          }
          iVar12 = iVar12 + iVar11 + iVar16;
          dst[uVar8 + (long)(int)(uVar2 * dst_stride)] = iVar24 + iVar12;
          dst[uVar8 + (long)(int)((uVar2 + 1) * dst_stride)] = iVar12;
          dst[uVar8 + (long)(int)((uVar2 + 2) * dst_stride)] = iVar11 + iVar16;
          uVar8 = uVar8 + 1;
          piVar7 = piVar7 + 1;
          piVar17 = piVar17 + 1;
        } while (uVar8 != (uint)width);
      }
    }
    else if (0 < width) {
      lVar1 = (long)dst_stride;
      lVar18 = (long)src_stride;
      piVar17 = src + lVar18 * 5;
      piVar5 = dst + lVar1 * 2;
      uVar8 = 0;
      do {
        iVar11 = src[uVar8] * src[uVar8];
        iVar20 = src[lVar18 + uVar8] * src[lVar18 + uVar8];
        iVar10 = src[(long)(src_stride * 2) + uVar8] * src[(long)(src_stride * 2) + uVar8];
        iVar23 = src[(long)(src_stride * 3) + uVar8] * src[(long)(src_stride * 3) + uVar8];
        iVar24 = src[(long)(src_stride << 2) + uVar8];
        iVar12 = iVar20 + iVar11 + iVar10;
        dst[uVar8] = iVar12;
        dst[lVar1 + uVar8] = iVar12 + iVar23;
        iVar24 = iVar24 * iVar24;
        piVar4 = piVar5;
        lVar19 = (ulong)(height - 3U) - 2;
        piVar13 = piVar17;
        iVar12 = iVar11;
        iVar15 = iVar20;
        iVar3 = iVar24;
        if (height < 6) {
          iVar6 = iVar23 + iVar10;
          uVar2 = 2;
        }
        else {
          do {
            iVar20 = iVar10;
            iVar11 = iVar15;
            iVar6 = iVar23 + iVar3;
            *piVar4 = iVar20 + iVar11 + iVar6 + iVar12;
            iVar24 = *piVar13 * *piVar13;
            lVar19 = lVar19 + -1;
            piVar4 = piVar4 + lVar1;
            piVar13 = piVar13 + lVar18;
            iVar12 = iVar11;
            iVar15 = iVar20;
            iVar10 = iVar23;
            iVar23 = iVar3;
            iVar3 = iVar24;
            uVar2 = height - 3U;
          } while (lVar19 != 0);
        }
        iVar20 = iVar20 + iVar6 + iVar24;
        dst[uVar8 + (long)(int)(uVar2 * dst_stride)] = iVar11 + iVar20;
        dst[uVar8 + (long)(int)((uVar2 + 1) * dst_stride)] = iVar20;
        dst[uVar8 + (long)(int)((uVar2 + 2) * dst_stride)] = iVar6 + iVar24;
        uVar8 = uVar8 + 1;
        piVar17 = piVar17 + 1;
        piVar5 = piVar5 + 1;
      } while (uVar8 != (uint)width);
    }
    if (0 < height) {
      lVar1 = (long)dst_stride;
      local_90 = 0x500000000;
      uVar8 = 0;
      piVar7 = dst;
      do {
        lVar18 = uVar8 * lVar1;
        iVar24 = dst[lVar18];
        iVar12 = dst[lVar18 + 1];
        iVar15 = dst[lVar18 + 2];
        iVar10 = dst[lVar18 + 3];
        iVar3 = iVar12 + iVar24 + iVar15;
        iVar23 = dst[lVar18 + 4];
        dst[lVar18] = iVar3;
        dst[lVar18 + 1] = iVar3 + iVar10;
        if (width < 6) {
          iVar3 = iVar10 + iVar15;
          uVar2 = 2;
        }
        else {
          uVar22 = 2;
          lVar19 = local_90;
          iVar11 = iVar24;
          iVar20 = iVar12;
          iVar6 = iVar23;
          do {
            iVar12 = iVar15;
            iVar24 = iVar20;
            iVar3 = iVar10 + iVar6;
            piVar7[uVar22] = iVar12 + iVar24 + iVar3 + iVar11;
            iVar23 = *(int *)((long)dst + (lVar19 >> 0x1e));
            uVar22 = uVar22 + 1;
            lVar19 = lVar19 + 0x100000000;
            iVar11 = iVar24;
            iVar20 = iVar12;
            iVar15 = iVar10;
            iVar10 = iVar6;
            iVar6 = iVar23;
            uVar2 = width - 3U;
          } while (width - 3U != uVar22);
        }
        iVar12 = iVar12 + iVar3 + iVar23;
        dst[lVar18 + (int)uVar2] = iVar24 + iVar12;
        dst[(int)(uVar2 + (int)lVar18 + 1)] = iVar12;
        dst[(int)(uVar2 + (int)lVar18 + 2)] = iVar3 + iVar23;
        uVar8 = uVar8 + 1;
        local_90 = local_90 + (lVar1 << 0x20);
        piVar7 = piVar7 + lVar1;
      } while (uVar8 != (uint)height);
    }
  }
  else if (r == 1) {
    lVar1 = (long)dst_stride;
    if (sqr == 0) {
      if (0 < width) {
        lVar18 = (long)src_stride;
        piVar7 = src + lVar18 * 3;
        piVar17 = dst + lVar1;
        uVar8 = 0;
        do {
          iVar24 = src[uVar8];
          iVar12 = src[lVar18 + uVar8];
          iVar16 = src[(long)(src_stride * 2) + uVar8];
          dst[uVar8] = iVar12 + iVar24;
          piVar5 = piVar17;
          piVar14 = piVar7;
          lVar19 = (ulong)(height - 2U) - 1;
          iVar15 = iVar24;
          iVar10 = iVar12;
          uVar2 = 1;
          if (3 < height) {
            do {
              iVar12 = iVar16;
              iVar24 = iVar10;
              *piVar5 = iVar15 + iVar24 + iVar12;
              iVar16 = *piVar14;
              lVar19 = lVar19 + -1;
              piVar5 = piVar5 + lVar1;
              piVar14 = piVar14 + lVar18;
              iVar15 = iVar24;
              iVar10 = iVar12;
              uVar2 = height - 2U;
            } while (lVar19 != 0);
          }
          dst[uVar8 + (long)(int)(uVar2 * dst_stride)] = iVar24 + iVar12 + iVar16;
          dst[uVar8 + (long)(int)((uVar2 + 1) * dst_stride)] = iVar12 + iVar16;
          uVar8 = uVar8 + 1;
          piVar7 = piVar7 + 1;
          piVar17 = piVar17 + 1;
        } while (uVar8 != (uint)width);
      }
    }
    else if (0 < width) {
      lVar18 = (long)src_stride;
      piVar17 = src + lVar18 * 3;
      piVar5 = dst + lVar1;
      uVar8 = 0;
      do {
        iVar10 = src[uVar8] * src[uVar8];
        iVar23 = src[lVar18 + uVar8] * src[lVar18 + uVar8];
        iVar15 = src[(long)(src_stride * 2) + uVar8] * src[(long)(src_stride * 2) + uVar8];
        dst[uVar8] = iVar23 + iVar10;
        piVar4 = piVar5;
        piVar13 = piVar17;
        lVar19 = (ulong)(height - 2U) - 1;
        iVar24 = iVar10;
        iVar12 = iVar23;
        uVar2 = 1;
        if (3 < height) {
          do {
            iVar23 = iVar15;
            iVar10 = iVar12;
            *piVar4 = iVar24 + iVar10 + iVar23;
            iVar15 = *piVar13 * *piVar13;
            lVar19 = lVar19 + -1;
            piVar4 = piVar4 + lVar1;
            piVar13 = piVar13 + lVar18;
            iVar24 = iVar10;
            iVar12 = iVar23;
            uVar2 = height - 2U;
          } while (lVar19 != 0);
        }
        dst[uVar8 + (long)(int)(uVar2 * dst_stride)] = iVar10 + iVar23 + iVar15;
        dst[uVar8 + (long)(int)((uVar2 + 1) * dst_stride)] = iVar23 + iVar15;
        uVar8 = uVar8 + 1;
        piVar17 = piVar17 + 1;
        piVar5 = piVar5 + 1;
      } while (uVar8 != (uint)width);
    }
    if (0 < height) {
      lVar18 = 0x300000000;
      uVar8 = 0;
      piVar7 = dst;
      do {
        lVar19 = uVar8 * lVar1;
        iVar24 = dst[lVar19];
        iVar12 = dst[lVar19 + 1];
        iVar15 = dst[lVar19 + 2];
        dst[lVar19] = iVar12 + iVar24;
        uVar2 = 1;
        if (3 < width) {
          uVar22 = 1;
          lVar9 = lVar18;
          iVar10 = iVar24;
          iVar23 = iVar12;
          do {
            iVar12 = iVar15;
            iVar24 = iVar23;
            piVar7[uVar22] = iVar10 + iVar24 + iVar12;
            iVar15 = *(int *)((long)dst + (lVar9 >> 0x1e));
            uVar22 = uVar22 + 1;
            lVar9 = lVar9 + 0x100000000;
            iVar10 = iVar24;
            iVar23 = iVar12;
            uVar2 = width - 2U;
          } while (width - 2U != uVar22);
        }
        dst[lVar19 + (int)uVar2] = iVar24 + iVar12 + iVar15;
        dst[(int)((int)lVar19 + uVar2 + 1)] = iVar12 + iVar15;
        uVar8 = uVar8 + 1;
        lVar18 = lVar18 + (lVar1 << 0x20);
        piVar7 = piVar7 + lVar1;
      } while (uVar8 != (uint)height);
    }
  }
  return;
}

Assistant:

static void boxsum(int32_t *src, int width, int height, int src_stride, int r,
                   int sqr, int32_t *dst, int dst_stride) {
  if (r == 1)
    boxsum1(src, width, height, src_stride, sqr, dst, dst_stride);
  else if (r == 2)
    boxsum2(src, width, height, src_stride, sqr, dst, dst_stride);
  else
    assert(0 && "Invalid value of r in self-guided filter");
}